

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int DoSetMaster(AActor *self,AActor *master)

{
  uint uVar1;
  player_t *ppVar2;
  BYTE BVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  AActor *pAVar7;
  uint uVar8;
  PClass *pPVar6;
  
  if (((self->flags3).Value & 0x2000) == 0) {
    return 0;
  }
  if (master == (AActor *)0x0) {
    (self->master).field_0.p = (AActor *)0x0;
    self->FriendPlayer = '\0';
    pPVar6 = (self->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
      (self->super_DThinker).super_DObject.Class = pPVar6;
    }
    uVar1 = (self->flags).Value;
    uVar8 = *(uint *)(pPVar6->Defaults + 0x18c) & 0x8000000;
    (self->flags).Value = uVar8 | uVar1 & 0xf7ffffff;
    level.total_monsters =
         (uint)((uVar8 | uVar1 & 0x400000) == 0x400000) +
         (level.total_monsters - (uint)((uVar1 & 0x8400000) == 0x400000));
    pAVar7 = (self->target).field_0.p;
    if ((pAVar7 != (AActor *)0x0) &&
       ((((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
        (bVar4 = AActor::IsHostile(self,pAVar7), !bVar4)))) {
      (self->target).field_0.p = (AActor *)0x0;
    }
    pAVar7 = (self->lastenemy).field_0.p;
    if ((pAVar7 != (AActor *)0x0) &&
       ((((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
        (bVar4 = AActor::IsHostile(self,pAVar7), !bVar4)))) {
      (self->lastenemy).field_0.p = (AActor *)0x0;
    }
    pAVar7 = (self->LastHeard).field_0.p;
    if (pAVar7 == (AActor *)0x0) {
      return 1;
    }
    if ((((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) &&
       (bVar4 = AActor::IsHostile(self,pAVar7), bVar4)) {
      return 1;
    }
    goto LAB_0050e0d5;
  }
  if (((master->flags3).Value & 0x2000) == 0) {
    if (master->player == (player_t *)0x0) {
      return 0;
    }
    (self->master).field_0.p = (AActor *)0x0;
    uVar1 = (self->flags).Value;
    level.total_monsters = level.total_monsters - (uint)((uVar1 & 0x8400000) == 0x400000);
    (self->flags).Value = uVar1 | 0x8000000;
    ppVar2 = master->player;
    if (ppVar2 == (player_t *)0x0) {
      BVar3 = '\0';
    }
    else {
      BVar3 = (char)((int)ppVar2 - 0xa60290U >> 5) * '=' + '\x01';
    }
    self->FriendPlayer = BVar3;
    pAVar7 = (ppVar2->attacker).field_0.p;
    if (pAVar7 != (AActor *)0x0) {
      if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if ((((pAVar7->flags).Value & 0x8000000) == 0) ||
           (((deathmatch.Value != 0 && (pAVar7->FriendPlayer != '\0')) &&
            (pAVar7->FriendPlayer != BVar3)))) {
          (self->target).field_0.p = pAVar7;
          (self->LastHeard).field_0.p = pAVar7;
        }
      }
      else {
        (ppVar2->attacker).field_0.p = (AActor *)0x0;
      }
    }
    pAVar7 = (self->target).field_0.p;
    if (pAVar7 == (AActor *)0x0) {
LAB_0050e065:
      pAVar7 = (AActor *)0x0;
    }
    else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->target).field_0.p = (AActor *)0x0;
      goto LAB_0050e065;
    }
    if (pAVar7 == master) {
      (self->target).field_0.p = (AActor *)0x0;
    }
    pAVar7 = (self->lastenemy).field_0.p;
    if (pAVar7 == (AActor *)0x0) {
LAB_0050e094:
      pAVar7 = (AActor *)0x0;
    }
    else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->lastenemy).field_0.p = (AActor *)0x0;
      goto LAB_0050e094;
    }
    if (pAVar7 == master) {
      (self->lastenemy).field_0.p = (AActor *)0x0;
    }
    pAVar7 = (self->LastHeard).field_0.p;
  }
  else {
    self->FriendPlayer = '\0';
    (self->master).field_0.p = master;
    uVar1 = (self->flags).Value;
    uVar8 = (master->flags).Value & 0x8000000;
    (self->flags).Value = uVar8 | uVar1 & 0xf7ffffff;
    level.total_monsters =
         (uint)((uVar8 | uVar1 & 0x400000) == 0x400000) +
         (level.total_monsters - (uint)((uVar1 & 0x8400000) == 0x400000));
    if (((master->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->master).field_0.p = (AActor *)0x0;
      master = (AActor *)0x0;
    }
    pAVar7 = (self->target).field_0.p;
    if (pAVar7 == (AActor *)0x0) {
LAB_0050df6f:
      pAVar7 = (AActor *)0x0;
    }
    else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->target).field_0.p = (AActor *)0x0;
      goto LAB_0050df6f;
    }
    if (pAVar7 == master) {
      (self->target).field_0.p = (AActor *)0x0;
    }
    if (master == (AActor *)0x0) {
LAB_0050df97:
      master = (AActor *)0x0;
    }
    else if (((master->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->master).field_0.p = (AActor *)0x0;
      goto LAB_0050df97;
    }
    pAVar7 = (self->lastenemy).field_0.p;
    if (pAVar7 == (AActor *)0x0) {
LAB_0050dfb6:
      pAVar7 = (AActor *)0x0;
    }
    else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->lastenemy).field_0.p = (AActor *)0x0;
      goto LAB_0050dfb6;
    }
    if (pAVar7 == master) {
      (self->lastenemy).field_0.p = (AActor *)0x0;
    }
    if (master == (AActor *)0x0) {
LAB_0050dfe5:
      master = (AActor *)0x0;
    }
    else if (((master->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->master).field_0.p = (AActor *)0x0;
      goto LAB_0050dfe5;
    }
    pAVar7 = (self->LastHeard).field_0.p;
  }
  if (pAVar7 == (AActor *)0x0) {
LAB_0050e0c9:
    pAVar7 = (AActor *)0x0;
  }
  else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->LastHeard).field_0.p = (AActor *)0x0;
    goto LAB_0050e0c9;
  }
  if (pAVar7 != master) {
    return 1;
  }
LAB_0050e0d5:
  (self->LastHeard).field_0.p = (AActor *)0x0;
  return 1;
}

Assistant:

int DoSetMaster (AActor *self, AActor *master)
{
    AActor *defs;
    if (self->flags3&MF3_ISMONSTER)
    {
        if (master)
        {
            if (master->flags3&MF3_ISMONSTER)
            {
                self->FriendPlayer = 0;
                self->master = master;
                level.total_monsters -= self->CountsAsKill();
                self->flags = (self->flags & ~MF_FRIENDLY) | (master->flags & MF_FRIENDLY);
                level.total_monsters += self->CountsAsKill();
                // Don't attack your new master
                if (self->target == self->master) self->target = NULL;
                if (self->lastenemy == self->master) self->lastenemy = NULL;
                if (self->LastHeard == self->master) self->LastHeard = NULL;
                return 1;
            }
            else if (master->player)
            {
                // [KS] Be friendly to this player
                self->master = NULL;
                level.total_monsters -= self->CountsAsKill();
                self->flags|=MF_FRIENDLY;
                self->SetFriendPlayer(master->player);

                AActor * attacker=master->player->attacker;
                if (attacker)
                {
                    if (!(attacker->flags&MF_FRIENDLY) || 
                        (deathmatch && attacker->FriendPlayer!=0 && attacker->FriendPlayer!=self->FriendPlayer))
                    {
                        self->LastHeard = self->target = attacker;
                    }
                }
                // And stop attacking him if necessary.
                if (self->target == master) self->target = NULL;
                if (self->lastenemy == master) self->lastenemy = NULL;
                if (self->LastHeard == master) self->LastHeard = NULL;
                return 1;
            }
        }
        else
        {
            self->master = NULL;
            self->FriendPlayer = 0;
            // Go back to whatever friendliness we usually have...
            defs = self->GetDefault();
            level.total_monsters -= self->CountsAsKill();
            self->flags = (self->flags & ~MF_FRIENDLY) | (defs->flags & MF_FRIENDLY);
            level.total_monsters += self->CountsAsKill();
            // ...And re-side with our friends.
            if (self->target && !self->IsHostile (self->target)) self->target = NULL;
            if (self->lastenemy && !self->IsHostile (self->lastenemy)) self->lastenemy = NULL;
            if (self->LastHeard && !self->IsHostile (self->LastHeard)) self->LastHeard = NULL;
            return 1;
        }
    }
    return 0;
}